

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O3

void __thiscall TestCase::TestCase(TestCase *this,char *thread_name)

{
  this->_vptr_TestCase = (_func_int **)&PTR__TestCase_00105d38;
  (this->mTestName)._M_dataplus._M_p = (pointer)&(this->mTestName).field_2;
  (this->mTestName)._M_string_length = 0;
  (this->mTestName).field_2._M_local_buf[0] = '\0';
  JHThread::Thread::Thread(&(this->mThread).super_Thread,thread_name,0);
  *(undefined ***)&this->mThread = &PTR__Thread_00105d60;
  (this->mThread).mObject = this;
  (this->mThread).mFunc = 0x11;
  *(undefined8 *)&(this->mThread).field_0x48 = 0;
  (this->mThread).mStop = false;
  (this->mThread).mHardStop = false;
  Mutex::Mutex(&this->mMutex,false);
  (this->mFilename)._M_dataplus._M_p = (pointer)&(this->mFilename).field_2;
  (this->mFilename)._M_string_length = 0;
  (this->mFilename).field_2._M_local_buf[0] = '\0';
  (this->mErrorString)._M_dataplus._M_p = (pointer)&(this->mErrorString).field_2;
  (this->mErrorString)._M_string_length = 0;
  (this->mErrorString).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

TestCase( const char *thread_name ) : mThread( thread_name, this, &TestCase::Run ) 
	{
	}